

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ptr<Expression> __thiscall Parser::factor(Parser *this)

{
  bool bVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parser *in_RSI;
  ptr<Expression> pVar3;
  undefined1 local_f0 [48];
  undefined1 local_c0 [48];
  undefined1 local_90 [48];
  undefined1 local_60 [80];
  Parser *this_local;
  ptr<Expression> *expr;
  
  local_60[0x47] = '\0';
  this_local = this;
  merge(this);
  bVar1 = match(in_RSI,Mult);
  if (bVar1) {
    consume(in_RSI);
    make<Multiplication>();
    factor((Parser *)local_60);
    make<BinaryOperator,std::shared_ptr<Multiplication>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
              ((shared_ptr<Multiplication> *)(local_60 + 0x20),
               (shared_ptr<Expression> *)(local_60 + 0x10),(shared_ptr<Expression> *)this);
    std::shared_ptr<Expression>::operator=
              ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_60 + 0x20));
    std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_60);
    std::shared_ptr<Multiplication>::~shared_ptr((shared_ptr<Multiplication> *)(local_60 + 0x10));
    _Var2._M_pi = extraout_RDX;
  }
  else {
    bVar1 = match(in_RSI,Div);
    if (bVar1) {
      consume(in_RSI);
      make<Division>();
      factor((Parser *)local_90);
      make<BinaryOperator,std::shared_ptr<Division>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                ((shared_ptr<Division> *)(local_90 + 0x20),
                 (shared_ptr<Expression> *)(local_90 + 0x10),(shared_ptr<Expression> *)this);
      std::shared_ptr<Expression>::operator=
                ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_90 + 0x20));
      std::shared_ptr<BinaryOperator>::~shared_ptr((shared_ptr<BinaryOperator> *)(local_90 + 0x20));
      std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_90);
      std::shared_ptr<Division>::~shared_ptr((shared_ptr<Division> *)(local_90 + 0x10));
      _Var2._M_pi = extraout_RDX_00;
    }
    else {
      bVar1 = match(in_RSI,Exp);
      if (bVar1) {
        consume(in_RSI);
        make<Exponentiation>();
        factor((Parser *)local_c0);
        make<BinaryOperator,std::shared_ptr<Exponentiation>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                  ((shared_ptr<Exponentiation> *)(local_c0 + 0x20),
                   (shared_ptr<Expression> *)(local_c0 + 0x10),(shared_ptr<Expression> *)this);
        std::shared_ptr<Expression>::operator=
                  ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_c0 + 0x20));
        std::shared_ptr<BinaryOperator>::~shared_ptr
                  ((shared_ptr<BinaryOperator> *)(local_c0 + 0x20));
        std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_c0);
        std::shared_ptr<Exponentiation>::~shared_ptr
                  ((shared_ptr<Exponentiation> *)(local_c0 + 0x10));
        _Var2._M_pi = extraout_RDX_01;
      }
      else {
        bVar1 = match(in_RSI,Mod);
        _Var2._M_pi = extraout_RDX_02;
        if (bVar1) {
          consume(in_RSI);
          make<Modulo>();
          factor((Parser *)local_f0);
          make<BinaryOperator,std::shared_ptr<Modulo>,std::shared_ptr<Expression>&,std::shared_ptr<Expression>>
                    ((shared_ptr<Modulo> *)(local_f0 + 0x20),
                     (shared_ptr<Expression> *)(local_f0 + 0x10),(shared_ptr<Expression> *)this);
          std::shared_ptr<Expression>::operator=
                    ((shared_ptr<Expression> *)this,(shared_ptr<BinaryOperator> *)(local_f0 + 0x20))
          ;
          std::shared_ptr<BinaryOperator>::~shared_ptr
                    ((shared_ptr<BinaryOperator> *)(local_f0 + 0x20));
          std::shared_ptr<Expression>::~shared_ptr((shared_ptr<Expression> *)local_f0);
          std::shared_ptr<Modulo>::~shared_ptr((shared_ptr<Modulo> *)(local_f0 + 0x10));
          _Var2._M_pi = extraout_RDX_03;
        }
      }
    }
  }
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar3.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::factor() {
    ptr<Expression> expr = merge();

    if(match(TokenType::Mult)) {
        consume();
        expr = make<BinaryOperator>(make<Multiplication>(), expr, factor());
    } else if(match(TokenType::Div)) {
        consume();
        expr = make<BinaryOperator>(make<Division>(), expr, factor());
    } else if(match(TokenType::Exp)) {
        consume();
        expr = make<BinaryOperator>(make<Exponentiation>(), expr, factor());
    } else if(match(TokenType::Mod)) {
        consume();
        expr = make<BinaryOperator>(make<Modulo>(), expr, factor());
    }

    return expr;
}